

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O1

ostream * std::operator<<(ostream *os,double2 *v)

{
  ostream *poVar1;
  char *this;
  _anonymous_namespace_ *this_00;
  string local_58;
  string local_38;
  
  this = "(";
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_
            (&local_38,(_anonymous_namespace_ *)this,v->_M_elems[0]);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_38._M_dataplus._M_p,local_38._M_string_length);
  this_00 = (_anonymous_namespace_ *)0x3c3de4;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_58,this_00,v->_M_elems[1]);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_58._M_dataplus._M_p,local_58._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const tinyusdz::value::double2 &v) {
  os << "(" << tinyusdz::dtos(v[0]) << ", " << tinyusdz::dtos(v[1]) << ")";
  return os;
}